

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::Fapply
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  bool bVar1;
  Geometry *this_00;
  MFIter *in_RCX;
  int in_EDX;
  nullptr_t in_RDI;
  Array4<const_double> *sarr;
  Array4<const_double> *szarr;
  Array4<const_double> *syarr;
  Array4<const_double> *sxarr;
  Real const_sigma;
  Array4<const_double> *stenarr;
  Array4<const_int> *dmskarr;
  Array4<double> *yarr;
  Array4<const_double> *xarr;
  Box *bx;
  MFIter mfi;
  iMultiFab *dmsk;
  GpuArray<double,_3U> dxinvarr;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *stencil;
  array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *sigma;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_fffffffffffffc30;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc50;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffc58;
  MFIter *in_stack_fffffffffffffc60;
  anon_class_56_7_76037297 *in_stack_fffffffffffffc70;
  Box *in_stack_fffffffffffffc78;
  MFIter *in_stack_fffffffffffffc90;
  undefined1 local_320 [64];
  undefined1 *local_2e0;
  undefined1 local_2d8 [64];
  undefined1 *local_298;
  undefined1 local_290 [64];
  undefined1 *local_250;
  FabArray<amrex::FArrayBox> *local_248;
  pointer local_240;
  undefined8 *local_238;
  undefined1 *local_230;
  GpuArray<double,_3U> *local_228;
  undefined8 local_220;
  FabArray<amrex::FArrayBox> *local_218;
  pointer local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 local_1f8 [64];
  undefined1 *local_1b8;
  undefined1 local_1b0 [64];
  undefined1 *local_170;
  undefined1 local_168 [184];
  MFIter local_b0;
  type local_50;
  GpuArray<double,_3U> local_48;
  pointer local_30;
  pointer local_28;
  MFIter *local_18;
  int local_10;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffc50 >> 0x38);
  local_18 = in_RCX;
  local_10 = in_EDX;
  Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  local_28 = (pointer)Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                      ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                    *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  local_30 = (pointer)Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                    *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      (in_stack_fffffffffffffc30,(size_type)in_RDI);
  CoordSys::InvCellSizeArray(&local_48,&this_00->super_CoordSys);
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)in_stack_fffffffffffffc30,(size_type)in_RDI);
  local_50 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                       ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                        in_stack_fffffffffffffc30);
  TilingIfNotGPU();
  MFIter::MFIter(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,(bool)do_tiling_);
  mfi_00 = local_18;
  while (bVar1 = MFIter::isValid((MFIter *)(local_168 + 0xb8)), bVar1) {
    MFIter::tilebox(in_stack_fffffffffffffc90);
    local_168._176_8_ = local_168 + 0x94;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_stack_fffffffffffffc38,mfi_00);
    local_168._136_8_ = local_168 + 0x48;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_stack_fffffffffffffc38,mfi_00);
    local_168._64_8_ = local_168;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffc38,mfi_00);
    local_170 = local_1b0;
    if (*(int *)((long)in_RDI + 0x560) == 1) {
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x148248c);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_stack_fffffffffffffc38,mfi_00)
      ;
      local_208 = local_1f8;
      local_218 = (FabArray<amrex::FArrayBox> *)local_168._64_8_;
      local_210 = (pointer)local_168._136_8_;
      local_200 = local_170;
      local_1b8 = local_208;
      LoopConcurrentOnCpu<amrex::MLNodeLaplacian::Fapply(int,int,amrex::MultiFab&,amrex::MultiFab_const&)const::__0>
                (in_stack_fffffffffffffc78,(anon_class_32_4_38d7586b *)in_stack_fffffffffffffc70);
    }
    else {
      std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
      operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                  *)mfi_00,(size_type)in_RDI);
      bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              mfi_00,in_RDI);
      if (bVar1) {
        local_220 = *(undefined8 *)((long)in_RDI + 0x578);
        local_248 = (FabArray<amrex::FArrayBox> *)local_168._64_8_;
        local_240 = (pointer)local_168._136_8_;
        local_238 = &local_220;
        local_230 = local_170;
        local_228 = &local_48;
        LoopConcurrentOnCpu<amrex::MLNodeLaplacian::Fapply(int,int,amrex::MultiFab&,amrex::MultiFab_const&)const::__1>
                  (in_stack_fffffffffffffc78,(anon_class_40_5_f78550ac *)in_stack_fffffffffffffc70);
      }
      else if ((((*(byte *)((long)in_RDI + 0x641) & 1) == 0) || (local_10 < 1)) &&
              ((*(byte *)((long)in_RDI + 0x642) & 1) == 0)) {
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)mfi_00,(size_type)in_RDI);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1482740);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffc38,mfi_00);
        in_stack_fffffffffffffc38 = (FabArray<amrex::FArrayBox> *)local_168._64_8_;
        LoopConcurrentOnCpu<amrex::MLNodeLaplacian::Fapply(int,int,amrex::MultiFab&,amrex::MultiFab_const&)const::__3>
                  (in_stack_fffffffffffffc78,(anon_class_40_5_a2277a71 *)in_stack_fffffffffffffc70);
      }
      else {
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)mfi_00,(size_type)in_RDI);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14825f1);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffc38,mfi_00);
        local_250 = local_290;
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)mfi_00,(size_type)in_RDI);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1482633);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffc38,mfi_00);
        local_298 = local_2d8;
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)mfi_00,(size_type)in_RDI);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1482675);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffc38,mfi_00);
        local_2e0 = local_320;
        LoopConcurrentOnCpu<amrex::MLNodeLaplacian::Fapply(int,int,amrex::MultiFab&,amrex::MultiFab_const&)const::__2>
                  (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      }
    }
    MFIter::operator++((MFIter *)(local_168 + 0xb8));
  }
  MFIter::~MFIter(mfi_00);
  return;
}

Assistant:

void
MLNodeLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLNodeLaplacian::Fapply()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];


#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto xarr_ma = in.const_arrays();
        auto yarr_ma = out.arrays();
        auto dmskarr_ma = dmsk.const_arrays();

        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto stenarr_ma = stencil->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_sten(i,j,k,xarr_ma[box_no],stenarr_ma[box_no],dmskarr_ma[box_no]);
            });
        }
        else if (sigma[0] == nullptr)
        {
            Real const_sigma = m_const_sigma;
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        else if ( (m_use_harmonic_average && mglev > 0) ||
                   m_use_mapped )
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               dxinvarr);
#endif
            });
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real const> const& xarr = in.const_array(mfi);
            Array4<Real> const& yarr = out.array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
                Array4<Real const> const& stenarr = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_sten(i,j,k,xarr,stenarr,dmskarr);
                });
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, dxinvarr);
                });
#endif
            }
            else if ( (m_use_harmonic_average && mglev > 0) ||
                       m_use_mapped )
            {
                AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                             Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                             Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   dxinvarr);
                });
#endif
            }
            else
            {
                Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, dxinvarr);
                });
#endif
           }
        }
    }
}